

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaUtil.c
# Opt level: O2

int Gia_ManCheckCoPhase(Gia_Man_t *p)

{
  Gia_Obj_t *pGVar1;
  int v;
  int iVar2;
  
  v = 0;
  iVar2 = 0;
  while( true ) {
    if (p->vCos->nSize <= v) {
      return iVar2;
    }
    pGVar1 = Gia_ManCo(p,v);
    if (pGVar1 == (Gia_Obj_t *)0x0) break;
    iVar2 = iVar2 - (int)((long)*(undefined8 *)pGVar1 >> 0x3f);
    v = v + 1;
  }
  return iVar2;
}

Assistant:

int Gia_ManCheckCoPhase( Gia_Man_t * p )
{
    Gia_Obj_t * pObj;
    int i, Counter = 0;
    Gia_ManForEachCo( p, pObj, i )
        Counter += pObj->fPhase;
    return Counter;
}